

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void codecomp(FuncState *fs,OpCode op,int cond,expdesc *e1,expdesc *e2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OpCode OVar5;
  
  iVar2 = luaK_exp2RK(fs,e1);
  iVar3 = luaK_exp2RK(fs,e2);
  if (((e2->k == VNONRELOC) && (uVar1 = (e2->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  if (((e1->k == VNONRELOC) && (uVar1 = (e1->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  iVar4 = iVar3;
  if (op != OP_EQ && cond == 0) {
    iVar4 = iVar2;
    iVar2 = iVar3;
  }
  OVar5 = 0x40;
  if (op == OP_EQ || cond != 0) {
    OVar5 = cond << 6;
  }
  luaK_code(fs,iVar4 << 0xe | op | iVar2 << 0x17 | OVar5,fs->ls->lastline);
  iVar2 = luaK_jump(fs);
  (e1->u).s.info = iVar2;
  e1->k = VJMP;
  return;
}

Assistant:

static void codecomp (FuncState *fs, OpCode op, int cond, expdesc *e1,
                                                          expdesc *e2) {
  int o1 = luaK_exp2RK(fs, e1);
  int o2 = luaK_exp2RK(fs, e2);
  freeexp(fs, e2);
  freeexp(fs, e1);
  if (cond == 0 && op != OP_EQ) {
    int temp;  /* exchange args to replace by `<' or `<=' */
    temp = o1; o1 = o2; o2 = temp;  /* o1 <==> o2 */
    cond = 1;
  }
  e1->u.s.info = condjump(fs, op, cond, o1, o2);
  e1->k = VJMP;
}